

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata_TLSF::MergeBlock(VmaBlockMetadata_TLSF *this,Block *block,Block *prev)

{
  Block *pBVar1;
  
  block->offset = prev->offset;
  block->size = block->size + prev->size;
  pBVar1 = prev->prevPhysical;
  block->prevPhysical = pBVar1;
  if (pBVar1 != (Block *)0x0) {
    pBVar1->nextPhysical = block;
  }
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Free(&this->m_BlockAllocator,prev);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::MergeBlock(Block* block, Block* prev)
{
    VMA_ASSERT(block->prevPhysical == prev && "Cannot merge seperate physical regions!");
    VMA_ASSERT(!prev->IsFree() && "Cannot merge block that belongs to free list!");

    block->offset = prev->offset;
    block->size += prev->size;
    block->prevPhysical = prev->prevPhysical;
    if (block->prevPhysical)
        block->prevPhysical->nextPhysical = block;
    m_BlockAllocator.Free(prev);
}